

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O3

Ignored __thiscall
re2::CaptureNamesWalker::ShortVisit(CaptureNamesWalker *this,Regexp *re,Ignored ignored)

{
  LogMessage LStack_188;
  
  LogMessage::LogMessage
            (&LStack_188,
             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/regexp.cc",0x25c,
             3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&LStack_188.str_,"CaptureNamesWalker::ShortVisit called",0x25);
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_188);
  return ignored;
}

Assistant:

virtual Ignored ShortVisit(Regexp* re, Ignored ignored) {
    // Should never be called: we use Walk not WalkExponential.
    LOG(DFATAL) << "CaptureNamesWalker::ShortVisit called";
    return ignored;
  }